

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.h
# Opt level: O2

void __thiscall
TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_>::Print
          (TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *this,char *name,ostream *out,
          MatrixOutputFormat form)

{
  ostream *poVar1;
  _List_node_base *p_Var2;
  
  poVar1 = std::operator<<(out,
                           "virtual void TPZDohrMatrix<double, TPZDohrSubstructCondense<double>>::Print(const char *, std::ostream &, const MatrixOutputFormat) const [TVar = double, TSubStruct = TPZDohrSubstructCondense<double>]"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,name);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Number of coarse equations ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->fNumCoarse);
  std::endl<char,std::char_traits<char>>(poVar1);
  p_Var2 = (_List_node_base *)&this->fGlobal;
  while (p_Var2 = (((_List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->fGlobal) {
    TPZDohrSubstructCondense<double>::Print
              (*(TPZDohrSubstructCondense<double> **)p_Var2[1]._M_next,out);
  }
  return;
}

Assistant:

void Print(const char *name, std::ostream& out,const MatrixOutputFormat form = EFormatted) const override
	{
		out << __PRETTY_FUNCTION__ << std::endl;
		out << name << std::endl;
		out << "Number of coarse equations " << fNumCoarse << std::endl;
		typename SubsList::const_iterator iter;
		for (iter=fGlobal.begin();iter!=fGlobal.end();iter++) {
			(*iter)->Print(out);
		}
	}